

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void __thiscall
KokkosTools::SpaceTimeStack::State::allocate
          (State *this,Space space,char *name,void *ptr,uint64_t size)

{
  ulong uVar1;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  Allocations::allocate(this->current_allocations + space,&local_50,ptr,size,this->stack_frame);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar1 = this->current_allocations[space].total_size;
  if (this->hwm_allocations[space].total_size < uVar1) {
    this->hwm_allocations[space].total_size = uVar1;
    std::
    _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
    ::operator=(&this->hwm_allocations[space].alloc_set._M_t,
                &this->current_allocations[space].alloc_set._M_t);
  }
  return;
}

Assistant:

void allocate(Space space, const char* name, const void* ptr,
                std::uint64_t size) {
    current_allocations[space].allocate(std::string(name), ptr, size,
                                        stack_frame);
    if (current_allocations[space].total_size >
        hwm_allocations[space].total_size) {
      hwm_allocations[space] = current_allocations[space];
    }
  }